

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<const_phmap::priv::(anonymous_namespace)::StringTable_&>::
MatchAndExplain(UnorderedElementsAreMatcherImpl<const_phmap::priv::(anonymous_namespace)::StringTable_&>
                *this,StringTable *container,MatchResultListener *listener)

{
  undefined1 auVar1 [16];
  char cVar2;
  undefined1 (*pauVar3) [16];
  pointer pMVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined1 auVar11 [11];
  undefined1 auVar12 [12];
  undefined1 auVar13 [13];
  undefined1 auVar14 [14];
  size_t sVar15;
  uint uVar16;
  pointer pMVar17;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_01;
  pointer pMVar19;
  long lVar20;
  pointer pcVar21;
  undefined1 (*pauVar22) [16];
  long lVar23;
  size_t sVar24;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *x;
  bool bVar25;
  undefined1 auVar26 [16];
  char in_XMM2_Ba;
  char in_XMM2_Bb;
  char in_XMM2_Bc;
  char in_XMM2_Bd;
  char in_XMM2_Be;
  char in_XMM2_Bf;
  char in_XMM2_Bg;
  char in_XMM2_Bh;
  char in_XMM2_Bi;
  char in_XMM2_Bj;
  char in_XMM2_Bk;
  char in_XMM2_Bl;
  char in_XMM2_Bm;
  char in_XMM2_Bn;
  char in_XMM2_Bo;
  byte in_XMM2_Bp;
  vector<char,_std::allocator<char>_> did_match;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  element_printouts;
  MatchMatrix matrix;
  DummyMatchResultListener dummy;
  allocator_type local_d9;
  MatchResultListener *local_d8;
  size_t local_d0;
  undefined1 local_c8 [16];
  pointer local_b8;
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  undefined1 (*local_70) [16];
  MatchMatrix local_68;
  MatchResultListener local_40;
  
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pauVar3 = (undefined1 (*) [16])
            (container->
            super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
            ).ctrl_;
  x = &((container->
        super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
        ).slots_)->pair;
  ppVar18 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)listener;
  if (pauVar3 == (undefined1 (*) [16])0x0) {
    pauVar22 = (undefined1 (*) [16])0x0;
  }
  else {
    cVar2 = (*pauVar3)[0];
    pauVar22 = pauVar3;
    while (cVar2 < -1) {
      auVar1 = *pauVar22;
      iVar7 = -(uint)(CONCAT13(in_XMM2_Bd,CONCAT12(in_XMM2_Bc,CONCAT11(in_XMM2_Bb,in_XMM2_Ba))) ==
                     CONCAT13(in_XMM2_Bd,CONCAT12(in_XMM2_Bc,CONCAT11(in_XMM2_Bb,in_XMM2_Ba))));
      iVar8 = -(uint)(CONCAT13(in_XMM2_Bh,CONCAT12(in_XMM2_Bg,CONCAT11(in_XMM2_Bf,in_XMM2_Be))) ==
                     CONCAT13(in_XMM2_Bh,CONCAT12(in_XMM2_Bg,CONCAT11(in_XMM2_Bf,in_XMM2_Be))));
      iVar9 = -(uint)(CONCAT13(in_XMM2_Bl,CONCAT12(in_XMM2_Bk,CONCAT11(in_XMM2_Bj,in_XMM2_Bi))) ==
                     CONCAT13(in_XMM2_Bl,CONCAT12(in_XMM2_Bk,CONCAT11(in_XMM2_Bj,in_XMM2_Bi))));
      iVar10 = -(uint)(CONCAT13(in_XMM2_Bp,CONCAT12(in_XMM2_Bo,CONCAT11(in_XMM2_Bn,in_XMM2_Bm))) ==
                      CONCAT13(in_XMM2_Bp,CONCAT12(in_XMM2_Bo,CONCAT11(in_XMM2_Bn,in_XMM2_Bm))));
      in_XMM2_Ba = -(auVar1[0] < (char)iVar7);
      in_XMM2_Bb = -(auVar1[1] < (char)((uint)iVar7 >> 8));
      in_XMM2_Bc = -(auVar1[2] < (char)((uint)iVar7 >> 0x10));
      in_XMM2_Bd = -(auVar1[3] < (char)((uint)iVar7 >> 0x18));
      in_XMM2_Be = -(auVar1[4] < (char)iVar8);
      in_XMM2_Bf = -(auVar1[5] < (char)((uint)iVar8 >> 8));
      in_XMM2_Bg = -(auVar1[6] < (char)((uint)iVar8 >> 0x10));
      in_XMM2_Bh = -(auVar1[7] < (char)((uint)iVar8 >> 0x18));
      in_XMM2_Bi = -(auVar1[8] < (char)iVar9);
      in_XMM2_Bj = -(auVar1[9] < (char)((uint)iVar9 >> 8));
      in_XMM2_Bk = -(auVar1[10] < (char)((uint)iVar9 >> 0x10));
      in_XMM2_Bl = -(auVar1[0xb] < (char)((uint)iVar9 >> 0x18));
      in_XMM2_Bm = -(auVar1[0xc] < (char)iVar10);
      in_XMM2_Bn = -(auVar1[0xd] < (char)((uint)iVar10 >> 8));
      in_XMM2_Bo = -(auVar1[0xe] < (char)((uint)iVar10 >> 0x10));
      in_XMM2_Bp = -(auVar1[0xf] < (char)((uint)iVar10 >> 0x18));
      auVar1[1] = in_XMM2_Bb;
      auVar1[0] = in_XMM2_Ba;
      auVar1[2] = in_XMM2_Bc;
      auVar1[3] = in_XMM2_Bd;
      auVar1[4] = in_XMM2_Be;
      auVar1[5] = in_XMM2_Bf;
      auVar1[6] = in_XMM2_Bg;
      auVar1[7] = in_XMM2_Bh;
      auVar1[8] = in_XMM2_Bi;
      auVar1[9] = in_XMM2_Bj;
      auVar1[10] = in_XMM2_Bk;
      auVar1[0xb] = in_XMM2_Bl;
      auVar1[0xc] = in_XMM2_Bm;
      auVar1[0xd] = in_XMM2_Bn;
      auVar1[0xe] = in_XMM2_Bo;
      auVar1[0xf] = in_XMM2_Bp;
      auVar6[1] = in_XMM2_Bb;
      auVar6[0] = in_XMM2_Ba;
      auVar6[2] = in_XMM2_Bc;
      auVar6[3] = in_XMM2_Bd;
      auVar6[4] = in_XMM2_Be;
      auVar6[5] = in_XMM2_Bf;
      auVar6[6] = in_XMM2_Bg;
      auVar6[7] = in_XMM2_Bh;
      auVar6[8] = in_XMM2_Bi;
      auVar6[9] = in_XMM2_Bj;
      auVar6[10] = in_XMM2_Bk;
      auVar6[0xb] = in_XMM2_Bl;
      auVar6[0xc] = in_XMM2_Bm;
      auVar6[0xd] = in_XMM2_Bn;
      auVar6[0xe] = in_XMM2_Bo;
      auVar6[0xf] = in_XMM2_Bp;
      auVar14[1] = in_XMM2_Bd;
      auVar14[0] = in_XMM2_Bc;
      auVar14[2] = in_XMM2_Be;
      auVar14[3] = in_XMM2_Bf;
      auVar14[4] = in_XMM2_Bg;
      auVar14[5] = in_XMM2_Bh;
      auVar14[6] = in_XMM2_Bi;
      auVar14[7] = in_XMM2_Bj;
      auVar14[8] = in_XMM2_Bk;
      auVar14[9] = in_XMM2_Bl;
      auVar14[10] = in_XMM2_Bm;
      auVar14[0xb] = in_XMM2_Bn;
      auVar14[0xc] = in_XMM2_Bo;
      auVar14[0xd] = in_XMM2_Bp;
      auVar13[1] = in_XMM2_Be;
      auVar13[0] = in_XMM2_Bd;
      auVar13[2] = in_XMM2_Bf;
      auVar13[3] = in_XMM2_Bg;
      auVar13[4] = in_XMM2_Bh;
      auVar13[5] = in_XMM2_Bi;
      auVar13[6] = in_XMM2_Bj;
      auVar13[7] = in_XMM2_Bk;
      auVar13[8] = in_XMM2_Bl;
      auVar13[9] = in_XMM2_Bm;
      auVar13[10] = in_XMM2_Bn;
      auVar13[0xb] = in_XMM2_Bo;
      auVar13[0xc] = in_XMM2_Bp;
      auVar12[1] = in_XMM2_Bf;
      auVar12[0] = in_XMM2_Be;
      auVar12[2] = in_XMM2_Bg;
      auVar12[3] = in_XMM2_Bh;
      auVar12[4] = in_XMM2_Bi;
      auVar12[5] = in_XMM2_Bj;
      auVar12[6] = in_XMM2_Bk;
      auVar12[7] = in_XMM2_Bl;
      auVar12[8] = in_XMM2_Bm;
      auVar12[9] = in_XMM2_Bn;
      auVar12[10] = in_XMM2_Bo;
      auVar12[0xb] = in_XMM2_Bp;
      auVar11[1] = in_XMM2_Bg;
      auVar11[0] = in_XMM2_Bf;
      auVar11[2] = in_XMM2_Bh;
      auVar11[3] = in_XMM2_Bi;
      auVar11[4] = in_XMM2_Bj;
      auVar11[5] = in_XMM2_Bk;
      auVar11[6] = in_XMM2_Bl;
      auVar11[7] = in_XMM2_Bm;
      auVar11[8] = in_XMM2_Bn;
      auVar11[9] = in_XMM2_Bo;
      auVar11[10] = in_XMM2_Bp;
      uVar16 = (ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB141(auVar14 >> 7,0) & 1) << 2 |
                        (ushort)(SUB131(auVar13 >> 7,0) & 1) << 3 |
                        (ushort)(SUB121(auVar12 >> 7,0) & 1) << 4 |
                        (ushort)(SUB111(auVar11 >> 7,0) & 1) << 5 |
                        (ushort)((byte)(CONCAT19(in_XMM2_Bp,
                                                 CONCAT18(in_XMM2_Bo,
                                                          CONCAT17(in_XMM2_Bn,
                                                                   CONCAT16(in_XMM2_Bm,
                                                                            CONCAT15(in_XMM2_Bl,
                                                                                     CONCAT14(
                                                  in_XMM2_Bk,
                                                  CONCAT13(in_XMM2_Bj,
                                                           CONCAT12(in_XMM2_Bi,
                                                                    CONCAT11(in_XMM2_Bh,in_XMM2_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                        (ushort)((byte)(CONCAT18(in_XMM2_Bp,
                                                 CONCAT17(in_XMM2_Bo,
                                                          CONCAT16(in_XMM2_Bn,
                                                                   CONCAT15(in_XMM2_Bm,
                                                                            CONCAT14(in_XMM2_Bl,
                                                                                     CONCAT13(
                                                  in_XMM2_Bk,
                                                  CONCAT12(in_XMM2_Bj,
                                                           CONCAT11(in_XMM2_Bi,in_XMM2_Bh)))))))) >>
                                       7) & 1) << 7 | (ushort)(in_XMM2_Bp >> 7) << 0xf) + 1;
      uVar5 = 0;
      if (uVar16 != 0) {
        for (; (uVar16 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      ppVar18 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(ulong)(uVar5 << 6);
      x = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)((long)&(ppVar18->first)._M_dataplus._M_p +
             (long)&(((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&x->first)->first)._M_dataplus);
      cVar2 = (*pauVar22)[uVar5];
      pauVar22 = (undefined1 (*) [16])(*pauVar22 + uVar5);
    }
  }
  local_b8 = (pointer)0x0;
  local_c8 = (undefined1  [16])0x0;
  local_40.stream_ = (ostream *)0x0;
  local_40._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_001ba2c8;
  local_d8 = listener;
  if (pauVar22 ==
      (undefined1 (*) [16])
      (*pauVar3 +
      (container->
      super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
      ).capacity_)) {
    pMVar19 = (this->matchers_).
              super__Vector_base<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>,_std::allocator<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pMVar17 = (this->matchers_).
              super__Vector_base<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>,_std::allocator<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    sVar24 = 0;
  }
  else {
    sVar24 = 0;
    local_70 = (undefined1 (*) [16])
               (*pauVar3 +
               (container->
               super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
               ).capacity_);
    do {
      if (local_d8->stream_ != (ostream *)0x0) {
        PrintToString<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  (&local_a8,(testing *)x,ppVar18);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
                   &local_a8);
        ppVar18 = extraout_RDX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_a8._M_dataplus._M_p._1_7_,local_a8._M_dataplus._M_p._0_1_) !=
            &local_a8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_a8._M_dataplus._M_p._1_7_,local_a8._M_dataplus._M_p._0_1_),
                          local_a8.field_2._M_allocated_capacity + 1);
          ppVar18 = extraout_RDX_00;
        }
      }
      pMVar4 = (this->matchers_).
               super__Vector_base<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>,_std::allocator<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pMVar17 = (this->matchers_).
                super__Vector_base<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>,_std::allocator<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pMVar19 = pMVar17;
      local_d0 = sVar24;
      if (pMVar17 != pMVar4) {
        lVar23 = 0;
        lVar20 = 0;
        pMVar19 = pMVar4;
        do {
          local_a8._M_dataplus._M_p._0_1_ =
               MatcherBase<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
               ::MatchAndExplain((MatcherBase<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                                  *)((long)&(pMVar19->
                                            super_MatcherBase<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                                            ).super_MatcherDescriberInterface.
                                            _vptr_MatcherDescriberInterface + lVar23),x,&local_40);
          std::vector<char,_std::allocator<char>_>::emplace_back<char>
                    ((vector<char,_std::allocator<char>_> *)local_c8,(char *)&local_a8);
          lVar20 = lVar20 + 1;
          pMVar19 = (this->matchers_).
                    super__Vector_base<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>,_std::allocator<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pMVar17 = (this->matchers_).
                    super__Vector_base<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>,_std::allocator<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          lVar23 = lVar23 + 0x18;
          ppVar18 = extraout_RDX_01;
        } while (lVar20 != ((long)pMVar17 - (long)pMVar19 >> 3) * -0x5555555555555555);
      }
      x = x + 1;
      cVar2 = (*pauVar22)[1];
      pauVar22 = (undefined1 (*) [16])(*pauVar22 + 1);
      while (cVar2 < -1) {
        auVar26[0] = -((char)(*pauVar22)[0] < -1);
        auVar26[1] = -((char)(*pauVar22)[1] < -1);
        auVar26[2] = -((char)(*pauVar22)[2] < -1);
        auVar26[3] = -((char)(*pauVar22)[3] < -1);
        auVar26[4] = -((char)(*pauVar22)[4] < -1);
        auVar26[5] = -((char)(*pauVar22)[5] < -1);
        auVar26[6] = -((char)(*pauVar22)[6] < -1);
        auVar26[7] = -((char)(*pauVar22)[7] < -1);
        auVar26[8] = -((char)(*pauVar22)[8] < -1);
        auVar26[9] = -((char)(*pauVar22)[9] < -1);
        auVar26[10] = -((char)(*pauVar22)[10] < -1);
        auVar26[0xb] = -((char)(*pauVar22)[0xb] < -1);
        auVar26[0xc] = -((char)(*pauVar22)[0xc] < -1);
        auVar26[0xd] = -((char)(*pauVar22)[0xd] < -1);
        auVar26[0xe] = -((char)(*pauVar22)[0xe] < -1);
        auVar26[0xf] = -((char)(*pauVar22)[0xf] < -1);
        uVar16 = (ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                         (ushort)(auVar26[0xf] >> 7) << 0xf) + 1;
        uVar5 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        ppVar18 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(ulong)(uVar5 << 6);
        x = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&(ppVar18->first)._M_dataplus._M_p + (long)&(x->first)._M_dataplus._M_p);
        cVar2 = (*pauVar22)[uVar5];
        pauVar22 = (undefined1 (*) [16])(*pauVar22 + uVar5);
      }
      sVar24 = local_d0 + 1;
    } while (pauVar22 != local_70);
  }
  local_68.num_matchers_ = ((long)pMVar17 - (long)pMVar19 >> 3) * -0x5555555555555555;
  local_a8._M_dataplus._M_p._0_1_ = 0;
  local_68.num_elements_ = sVar24;
  std::vector<char,_std::allocator<char>_>::vector
            (&local_68.matched_,local_68.num_matchers_ * sVar24,(value_type_conflict1 *)&local_a8,
             &local_d9);
  if (sVar24 != 0) {
    pMVar17 = (this->matchers_).
              super__Vector_base<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>,_std::allocator<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pMVar19 = (this->matchers_).
              super__Vector_base<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>,_std::allocator<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    sVar15 = 0;
    pcVar21 = (pointer)local_c8._0_8_;
    do {
      bVar25 = pMVar19 != pMVar17;
      pMVar19 = pMVar17;
      if (bVar25) {
        lVar20 = 0;
        do {
          local_68.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar20 + local_68.num_matchers_ * sVar15] =
               pcVar21[lVar20] != '\0';
          lVar20 = lVar20 + 1;
          pMVar17 = (this->matchers_).
                    super__Vector_base<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>,_std::allocator<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pMVar19 = (this->matchers_).
                    super__Vector_base<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>,_std::allocator<testing::Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        } while (lVar20 != ((long)pMVar19 - (long)pMVar17 >> 3) * -0x5555555555555555);
        pcVar21 = pcVar21 + lVar20;
      }
      sVar15 = sVar15 + 1;
    } while (sVar15 != sVar24);
  }
  if ((pointer)local_c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._0_8_,(long)local_b8 - local_c8._0_8_);
  }
  bVar25 = UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
                     (&this->super_UnorderedElementsAreMatcherImplBase,&local_88,&local_68,local_d8)
  ;
  if (bVar25) {
    bVar25 = UnorderedElementsAreMatcherImplBase::FindPairing
                       (&this->super_UnorderedElementsAreMatcherImplBase,&local_68,local_d8);
  }
  else {
    bVar25 = false;
  }
  if (local_68.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  return bVar25;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    StlContainerReference stl_container = View::ConstReference(container);
    ::std::vector<std::string> element_printouts;
    MatchMatrix matrix =
        AnalyzeElements(stl_container.begin(), stl_container.end(),
                        &element_printouts, listener);

    return VerifyMatchMatrix(element_printouts, matrix, listener) &&
           FindPairing(matrix, listener);
  }